

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_CCtx_setParams(ZSTD_CCtx *cctx,ZSTD_parameters params)

{
  ZSTD_compressionParameters cParams;
  ZSTD_frameParameters fparams;
  ZSTD_compressionParameters cparams;
  uint uVar1;
  size_t sVar2;
  size_t code;
  undefined8 in_RDI;
  ZSTD_CCtx *in_stack_00000008;
  ZSTD_CCtx *in_stack_00000018;
  undefined4 in_stack_00000020;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  undefined1 in_stack_ffffffffffffff64 [12];
  undefined8 *puVar3;
  ZSTD_strategy in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffffe4;
  ZSTD_strategy in_stack_fffffffffffffff8;
  undefined4 uVar4;
  undefined4 uStack_4;
  
  puVar3 = &stack0x00000008;
  cParams._4_12_ = in_stack_ffffffffffffff64;
  cParams.windowLog = in_stack_00000020;
  cParams.minMatch = (int)puVar3;
  cParams.targetLength = (int)((ulong)puVar3 >> 0x20);
  cParams.strategy = in_stack_ffffffffffffff78;
  sVar2 = ZSTD_checkCParams(cParams);
  uVar1 = ERR_isError(sVar2);
  if (uVar1 == 0) {
    fparams.checksumFlag = in_stack_ffffffffffffff78;
    fparams.contentSizeFlag = (int)((ulong)puVar3 >> 0x20);
    fparams.noDictIDFlag = in_stack_ffffffffffffff7c;
    code = ZSTD_CCtx_setFParams(in_stack_00000018,fparams);
    uVar1 = ERR_isError(code);
    if (uVar1 == 0) {
      cparams.chainLog = in_stack_ffffffffffffffe4;
      cparams.windowLog = in_stack_00000020;
      cparams.hashLog = (int)sVar2;
      cparams.searchLog = (int)(sVar2 >> 0x20);
      cparams.minMatch = (int)in_RDI;
      cparams.targetLength = (int)((ulong)in_RDI >> 0x20);
      cparams.strategy = in_stack_fffffffffffffff8;
      sVar2 = ZSTD_CCtx_setCParams(in_stack_00000008,cparams);
      uVar1 = ERR_isError(sVar2);
      if (uVar1 == 0) {
        uVar4 = 0;
        uStack_4 = 0;
      }
      else {
        uVar4 = (undefined4)sVar2;
        uStack_4 = (undefined4)(sVar2 >> 0x20);
      }
    }
    else {
      uVar4 = (undefined4)code;
      uStack_4 = (undefined4)(code >> 0x20);
    }
  }
  else {
    uVar4 = (undefined4)sVar2;
    uStack_4 = (undefined4)(sVar2 >> 0x20);
  }
  return CONCAT44(uStack_4,uVar4);
}

Assistant:

size_t ZSTD_CCtx_setParams(ZSTD_CCtx* cctx, ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParams");
    /* First check cParams, because we want to update all or none. */
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    /* Next set fParams, because this could fail if the cctx isn't in init stage. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setFParams(cctx, params.fParams), "");
    /* Finally set cParams, which should succeed. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setCParams(cctx, params.cParams), "");
    return 0;
}